

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void inverse_transform_inter_block
               (AV1_COMMON *cm,DecoderCodingBlock *dcb,aom_reader *r,int plane,int blk_row,
               int blk_col,TX_SIZE tx_size)

{
  PLANE_TYPE PVar1;
  int in_ECX;
  undefined8 in_RDX;
  DecoderCodingBlock *in_RSI;
  undefined4 in_R8D;
  int in_R9D;
  int unaff_retaddr;
  uint8_t *dst;
  TX_TYPE tx_type;
  _Bool reduced_tx_set_used;
  macroblockd_plane *pd;
  PLANE_TYPE plane_type;
  MACROBLOCKD *xd;
  TX_SIZE in_stack_ffffffffffffffcb;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  DecoderCodingBlock *dcb_00;
  
  dcb_00 = in_RSI;
  PVar1 = get_plane_type(in_ECX);
  av1_get_tx_type((MACROBLOCKD *)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),
                  (PLANE_TYPE)((ulong)in_RSI >> 0x38),(int)in_RSI,
                  CONCAT13(PVar1,(int3)in_stack_ffffffffffffffcc),in_stack_ffffffffffffffcb,
                  (int)((ulong)((in_RSI->xd).plane + in_ECX) >> 0x20));
  inverse_transform_block
            (dcb_00,(int)((ulong)in_RDX >> 0x20),(TX_TYPE)((ulong)in_RDX >> 0x18),
             (TX_SIZE)((ulong)in_RDX >> 0x10),(uint8_t *)CONCAT44(in_ECX,in_R8D),in_R9D,
             unaff_retaddr);
  return;
}

Assistant:

static inline void inverse_transform_inter_block(
    const AV1_COMMON *const cm, DecoderCodingBlock *dcb, aom_reader *const r,
    const int plane, const int blk_row, const int blk_col,
    const TX_SIZE tx_size) {
  (void)r;
  MACROBLOCKD *const xd = &dcb->xd;
  PLANE_TYPE plane_type = get_plane_type(plane);
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const bool reduced_tx_set_used = cm->features.reduced_tx_set_used;
  // tx_type was read out in av1_read_coeffs_txb.
  const TX_TYPE tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col,
                                          tx_size, reduced_tx_set_used);

  uint8_t *dst =
      &pd->dst.buf[(blk_row * pd->dst.stride + blk_col) << MI_SIZE_LOG2];
  inverse_transform_block(dcb, plane, tx_type, tx_size, dst, pd->dst.stride,
                          reduced_tx_set_used);
#if CONFIG_MISMATCH_DEBUG
  int pixel_c, pixel_r;
  BLOCK_SIZE bsize = txsize_to_bsize[tx_size];
  int blk_w = block_size_wide[bsize];
  int blk_h = block_size_high[bsize];
  const int mi_row = -xd->mb_to_top_edge >> (3 + MI_SIZE_LOG2);
  const int mi_col = -xd->mb_to_left_edge >> (3 + MI_SIZE_LOG2);
  mi_to_pixel_loc(&pixel_c, &pixel_r, mi_col, mi_row, blk_col, blk_row,
                  pd->subsampling_x, pd->subsampling_y);
  mismatch_check_block_tx(dst, pd->dst.stride, cm->current_frame.order_hint,
                          plane, pixel_c, pixel_r, blk_w, blk_h,
                          xd->cur_buf->flags & YV12_FLAG_HIGHBITDEPTH);
#endif
}